

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCharStrndup(void)

{
  int iVar1;
  int iVar2;
  char *val;
  xmlChar *val_00;
  int local_2c;
  int local_28;
  int n_len;
  int len;
  int n_cur;
  char *cur;
  xmlChar *ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (n_len = 0; n_len < 4; n_len = n_len + 1) {
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_const_char_ptr(n_len,0);
      local_28 = gen_int(local_2c,1);
      if (val != (char *)0x0) {
        iVar2 = xmlStrlen(val);
        if (iVar2 < local_28) {
          local_28 = 0;
        }
      }
      val_00 = (xmlChar *)xmlCharStrndup(val,local_28);
      desret_xmlChar_ptr(val_00);
      call_tests = call_tests + 1;
      des_const_char_ptr(n_len,val,0);
      des_int(local_2c,local_28,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCharStrndup",(ulong)(uint)(iVar2 - iVar1));
        ret_val._4_4_ = ret_val._4_4_ + 1;
        printf(" %d",(ulong)(uint)n_len);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlCharStrndup(void) {
    int test_ret = 0;

    int mem_base;
    xmlChar * ret_val;
    const char * cur; /* the input char * */
    int n_cur;
    int len; /* the len of @cur */
    int n_len;

    for (n_cur = 0;n_cur < gen_nb_const_char_ptr;n_cur++) {
    for (n_len = 0;n_len < gen_nb_int;n_len++) {
        mem_base = xmlMemBlocks();
        cur = gen_const_char_ptr(n_cur, 0);
        len = gen_int(n_len, 1);
        if ((cur != NULL) &&
            (len > xmlStrlen(BAD_CAST cur)))
            len = 0;

        ret_val = xmlCharStrndup(cur, len);
        desret_xmlChar_ptr(ret_val);
        call_tests++;
        des_const_char_ptr(n_cur, cur, 0);
        des_int(n_len, len, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlCharStrndup",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_cur);
            printf(" %d", n_len);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}